

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O3

void reset_channel_effects(IT_CHANNEL *channel)

{
  IT_PLAYING *pIVar1;
  
  channel->volslide = '\0';
  channel->xm_volslide = '\0';
  channel->panslide = '\0';
  channel->channelvolslide = '\0';
  channel->arpeggio_table = "";
  channel->arpeggio_offsets[0] = '\0';
  channel->arpeggio_offsets[1] = '\0';
  channel->arpeggio_offsets[2] = '\0';
  channel->retrig = '\0';
  if (channel->xm_retrig != '\0') {
    channel->xm_retrig = '\0';
    channel->retrig_tick = 0;
  }
  channel->tremor_time = channel->tremor_time & 0x7f;
  channel->portamento = 0;
  channel->toneporta = 0;
  if (channel->ptm_toneslide != '\0') {
    channel->last_toneslide_tick = channel->toneslide_tick;
  }
  channel->ptm_last_toneslide = channel->ptm_toneslide;
  channel->ptm_toneslide = '\0';
  channel->toneslide_tick = '\0';
  channel->okt_toneslide = '\0';
  pIVar1 = channel->playing;
  if (pIVar1 != (IT_PLAYING *)0x0) {
    pIVar1->vibrato_n = '\0';
    pIVar1->tremolo_speed = '\0';
    pIVar1->tremolo_depth = '\0';
    pIVar1->panbrello_speed = '\0';
  }
  return;
}

Assistant:

static void reset_channel_effects(IT_CHANNEL *channel)
{
	channel->volslide = 0;
	channel->xm_volslide = 0;
	channel->panslide = 0;
	channel->channelvolslide = 0;
	channel->arpeggio_table = (const unsigned char *) &arpeggio_mod;
	memset(channel->arpeggio_offsets, 0, sizeof(channel->arpeggio_offsets));
	channel->retrig = 0;
	if (channel->xm_retrig) {
		channel->xm_retrig = 0;
		channel->retrig_tick = 0;
	}
	channel->tremor_time &= 127;
	channel->portamento = 0;
	channel->toneporta = 0;
	if (channel->ptm_toneslide) {
		channel->ptm_last_toneslide = channel->ptm_toneslide;
		channel->last_toneslide_tick = channel->toneslide_tick;
	} else
		channel->ptm_last_toneslide = 0;
	channel->ptm_toneslide = 0;
	channel->toneslide_tick = 0;
	channel->okt_toneslide = 0;
	if (channel->playing) {
		channel->playing->vibrato_n = 0;
		channel->playing->tremolo_speed = 0;
		channel->playing->tremolo_depth = 0;
		channel->playing->panbrello_speed = 0;
	}
}